

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O2

int xmlValidatePushElement(xmlValidCtxtPtr ctxt,xmlDocPtr doc,xmlNodePtr elem,xmlChar *qname)

{
  xmlElementPtr pxVar1;
  _xmlElementContent *p_Var2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  xmlNodePtr node;
  xmlValidState *pxVar6;
  xmlRegExecCtxtPtr pxVar7;
  uint uVar8;
  uint uVar9;
  xmlElementContentPtr pxVar10;
  xmlRegexpPtr comp;
  xmlChar *pxVar11;
  xmlValidCtxtPtr pxVar12;
  int local_40;
  int extsubset;
  xmlChar *local_38;
  
  extsubset = 0;
  if (ctxt == (xmlValidCtxtPtr)0x0) {
    return 0;
  }
  uVar5 = 1;
  if (((ctxt->vstateNr < 1) || (pxVar6 = ctxt->vstate, pxVar6 == (xmlValidState *)0x0)) ||
     (pxVar1 = pxVar6->elemDecl, pxVar1 == (xmlElementPtr)0x0)) goto switchD_00156e9f_caseD_2;
  switch(pxVar1->etype) {
  case XML_ELEMENT_TYPE_UNDEFINED:
  case XML_ELEMENT_TYPE_EMPTY:
switchD_00156e9f_caseD_0:
    uVar5 = 0;
    break;
  case XML_ELEMENT_TYPE_MIXED:
    pxVar10 = pxVar1->content;
    if ((pxVar10 == (xmlElementContentPtr)0x0) ||
       (uVar5 = 0, pxVar10->type != XML_ELEMENT_CONTENT_PCDATA)) {
      local_38 = xmlSplitQName3(qname,&local_40);
      if (local_38 != (xmlChar *)0x0) {
        uVar5 = 1;
        for (; pxVar10 != (xmlElementContentPtr)0x0; pxVar10 = pxVar10->c2) {
          pxVar12 = ctxt;
          if (pxVar10->type == XML_ELEMENT_CONTENT_OR) {
            p_Var2 = pxVar10->c1;
            if (p_Var2 == (_xmlElementContent *)0x0) goto LAB_00157143;
            if (p_Var2->type != XML_ELEMENT_CONTENT_PCDATA) {
              if (p_Var2->type != XML_ELEMENT_CONTENT_ELEMENT) goto LAB_00157143;
              if ((p_Var2->prefix != (xmlChar *)0x0) &&
                 (iVar3 = xmlStrncmp(p_Var2->prefix,qname,local_40), iVar3 == 0)) {
                pxVar11 = pxVar10->c1->name;
                goto LAB_0015704c;
              }
            }
          }
          else {
            if (pxVar10->type != XML_ELEMENT_CONTENT_ELEMENT) goto LAB_00157143;
            if ((pxVar10->prefix != (xmlChar *)0x0) &&
               (iVar3 = xmlStrncmp(pxVar10->prefix,qname,local_40), iVar3 == 0)) {
              pxVar11 = pxVar10->name;
LAB_0015704c:
              iVar3 = xmlStrEqual(pxVar11,local_38);
              if (iVar3 != 0) goto switchD_00156e9f_caseD_2;
            }
          }
        }
        goto switchD_00156e9f_caseD_0;
      }
      uVar5 = 0;
      for (; pxVar10 != (xmlElementContentPtr)0x0; pxVar10 = pxVar10->c2) {
        if (pxVar10->type == XML_ELEMENT_CONTENT_OR) {
          p_Var2 = pxVar10->c1;
          if (p_Var2 == (_xmlElementContent *)0x0) goto LAB_00157141;
          if (p_Var2->type != XML_ELEMENT_CONTENT_PCDATA) {
            if (p_Var2->type != XML_ELEMENT_CONTENT_ELEMENT) goto LAB_00157141;
            if (p_Var2->prefix == (xmlChar *)0x0) {
              pxVar11 = p_Var2->name;
              goto LAB_0015712a;
            }
          }
          goto LAB_00157136;
        }
        if (pxVar10->type != XML_ELEMENT_CONTENT_ELEMENT) {
LAB_00157141:
          pxVar12 = (xmlValidCtxtPtr)0x0;
LAB_00157143:
          uVar5 = 0;
          xmlErrValid(pxVar12,XML_DTD_MIXED_CORRUPT,"Internal: MIXED struct corrupted\n",(char *)0x0
                     );
          break;
        }
        if (pxVar10->prefix != (xmlChar *)0x0) goto LAB_00157136;
        pxVar11 = pxVar10->name;
LAB_0015712a:
        iVar3 = xmlStrEqual(pxVar11,qname);
        if (iVar3 != 0) {
          uVar5 = 1;
          break;
        }
LAB_00157136:
      }
    }
    break;
  case XML_ELEMENT_TYPE_ELEMENT:
    if (pxVar6->exec == (xmlRegExecCtxtPtr)0x0) break;
    uVar5 = 0;
    uVar4 = xmlRegExecPushString(pxVar6->exec,qname,(void *)0x0);
    if (uVar4 != 0xfffffffb) {
      uVar5 = ~uVar4 >> 0x1f;
      break;
    }
    goto LAB_00156f93;
  }
switchD_00156e9f_caseD_2:
  node = (xmlNodePtr)xmlValidGetElemDecl(ctxt,doc,elem,&extsubset);
  iVar3 = ctxt->vstateNr;
  uVar4 = ctxt->vstateMax;
  if (iVar3 < (int)uVar4) {
    pxVar6 = ctxt->vstateTab;
LAB_00156f20:
    ctxt->vstate = pxVar6 + iVar3;
    pxVar6[iVar3].elemDecl = (xmlElementPtr)node;
    pxVar6[iVar3].node = elem;
    if ((node != (xmlNodePtr)0x0) && (*(int *)&node->ns == 4)) {
      comp = (xmlRegexpPtr)node->psvi;
      if (comp == (xmlRegexpPtr)0x0) {
        xmlValidBuildContentModel(ctxt,(xmlElementPtr)node);
        comp = (xmlRegexpPtr)node->psvi;
        if (comp == (xmlRegexpPtr)0x0) {
          ctxt->vstateTab[ctxt->vstateNr].exec = (xmlRegExecCtxtPtr)0x0;
          xmlErrValidNode(ctxt,node,XML_ERR_INTERNAL_ERROR,
                          "Failed to build content model regexp for %s\n",elem->name,(xmlChar *)0x0,
                          (xmlChar *)0x0);
          iVar3 = ctxt->vstateNr;
          goto LAB_001570cd;
        }
      }
      pxVar7 = xmlRegNewExecCtxt(comp,(xmlRegExecCallbacks)0x0,(void *)0x0);
      iVar3 = ctxt->vstateNr;
      ctxt->vstateTab[iVar3].exec = pxVar7;
      if (pxVar7 == (xmlRegExecCtxtPtr)0x0) goto LAB_00156f93;
    }
LAB_001570cd:
    ctxt->vstateNr = iVar3 + 1;
  }
  else {
    if ((int)uVar4 < 1) {
      uVar9 = 10;
LAB_00156efe:
      pxVar6 = (xmlValidState *)(*xmlRealloc)(ctxt->vstateTab,(ulong)uVar9 * 0x18);
      if (pxVar6 != (xmlValidState *)0x0) {
        ctxt->vstateTab = pxVar6;
        ctxt->vstateMax = uVar9;
        iVar3 = ctxt->vstateNr;
        goto LAB_00156f20;
      }
    }
    else if (uVar4 < 1000000000) {
      uVar8 = uVar4 + 1 >> 1;
      uVar9 = uVar8 + uVar4;
      if (1000000000 - uVar8 < uVar4) {
        uVar9 = 1000000000;
      }
      goto LAB_00156efe;
    }
LAB_00156f93:
    xmlVErrMemory(ctxt);
  }
  return uVar5;
}

Assistant:

int
xmlValidatePushElement(xmlValidCtxtPtr ctxt, xmlDocPtr doc,
                       xmlNodePtr elem, const xmlChar *qname) {
    int ret = 1;
    xmlElementPtr eDecl;
    int extsubset = 0;

    if (ctxt == NULL)
        return(0);

    if ((ctxt->vstateNr > 0) && (ctxt->vstate != NULL)) {
	xmlValidStatePtr state = ctxt->vstate;
	xmlElementPtr elemDecl;

	/*
	 * Check the new element against the content model of the new elem.
	 */
	if (state->elemDecl != NULL) {
	    elemDecl = state->elemDecl;

	    switch(elemDecl->etype) {
		case XML_ELEMENT_TYPE_UNDEFINED:
		    ret = 0;
		    break;
		case XML_ELEMENT_TYPE_EMPTY:
		    ret = 0;
		    break;
		case XML_ELEMENT_TYPE_ANY:
		    /* I don't think anything is required then */
		    break;
		case XML_ELEMENT_TYPE_MIXED:
		    /* simple case of declared as #PCDATA */
		    if ((elemDecl->content != NULL) &&
			(elemDecl->content->type ==
			 XML_ELEMENT_CONTENT_PCDATA)) {
			ret = 0;
		    } else {
			ret = xmlValidateCheckMixed(ctxt, elemDecl->content,
				                    qname);
		    }
		    break;
		case XML_ELEMENT_TYPE_ELEMENT:
		    /*
		     * TODO:
		     * VC: Standalone Document Declaration
		     *     - element types with element content, if white space
		     *       occurs directly within any instance of those types.
		     */
		    if (state->exec != NULL) {
			ret = xmlRegExecPushString(state->exec, qname, NULL);
                        if (ret == XML_REGEXP_OUT_OF_MEMORY) {
                            xmlVErrMemory(ctxt);
                            return(0);
                        }
			if (ret < 0) {
			    ret = 0;
			} else {
			    ret = 1;
			}
		    }
		    break;
	    }
	}
    }
    eDecl = xmlValidGetElemDecl(ctxt, doc, elem, &extsubset);
    vstateVPush(ctxt, eDecl, elem);
    return(ret);
}